

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluDrawUtil.cpp
# Opt level: O2

void glu::draw(RenderContext *context,deUint32 program,int numVertexArrays,
              VertexArrayBinding *vertexArrays,PrimitiveList *primitives,DrawUtilCallback *callback)

{
  bool bVar1;
  ContextType ctxType;
  
  ctxType.super_ApiType.m_bits = (ApiType)(*context->_vptr_RenderContext[2])();
  if (((uint)ctxType.super_ApiType.m_bits & 0x300) != 0x100) {
    bVar1 = contextSupports(ctxType,(ApiType)0x13);
    if (!bVar1) {
      drawFromUserPointers(context,program,numVertexArrays,vertexArrays,primitives,callback);
      return;
    }
  }
  drawFromVAOBuffers(context,program,numVertexArrays,vertexArrays,primitives,callback);
  return;
}

Assistant:

void draw (const RenderContext& context, deUint32 program, int numVertexArrays, const VertexArrayBinding* vertexArrays, const PrimitiveList& primitives, DrawUtilCallback* callback)
{
	const glu::ContextType ctxType = context.getType();

	if (isContextTypeGLCore(ctxType) || contextSupports(ctxType, ApiType::es(3,1)))
		drawFromVAOBuffers(context, program, numVertexArrays, vertexArrays, primitives, callback);
	else
	{
		DE_ASSERT(isContextTypeES(ctxType));
		drawFromUserPointers(context, program, numVertexArrays, vertexArrays, primitives, callback);
	}
}